

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceSpanTask::run(search *sch,multi_ex *ec)

{
  v_array<unsigned_int> *a;
  uint uVar1;
  int *piVar2;
  pointer ppeVar3;
  long lVar4;
  long lVar5;
  ptag hi;
  uint32_t uVar6;
  uint32_t uVar7;
  action aVar8;
  stringstream *psVar9;
  ostream *poVar10;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  action aVar13;
  predictor P;
  
  piVar2 = (int *)sch->task_data;
  a = (v_array<unsigned_int> *)(piVar2 + 2);
  Search::predictor::predictor(&P,sch,0);
  for (uVar11 = 1; uVar11 <= *(ulong *)(piVar2 + 0x12); uVar11 = uVar11 + 1) {
    aVar8 = 1;
    for (uVar12 = 0;
        ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3);
        uVar12 = uVar12 + 1) {
      uVar1 = (ppeVar3[uVar12]->l).multi.label;
      lVar4 = *(long *)(piVar2 + 4);
      lVar5 = *(long *)(piVar2 + 2);
      hi = (ptag)uVar12;
      Search::predictor::set_tag(&P,hi + 1);
      Search::predictor::set_learner_id(&P,uVar11 - 1);
      aVar13 = uVar1;
      if (*piVar2 == 1) {
        if ((aVar8 == 1) || ((aVar8 & 3) - 1 < 2)) {
          Search::predictor::set_allowed(&P,a);
          aVar13 = (uint)(uVar1 != 0);
          if ((uVar1 & 2) != 0) {
            aVar13 = uVar1;
          }
        }
        else {
          aVar13 = aVar8 + 2;
          if ((aVar8 & 3) != 3) {
            aVar13 = aVar8;
          }
          Search::predictor::set_allowed(&P,aVar8 + 1);
          Search::predictor::add_allowed(&P,aVar13);
          if (uVar1 == aVar8 + 1) {
            aVar13 = uVar1;
          }
        }
      }
      else if (*piVar2 == 0) {
        if (aVar8 == 1) {
          Search::predictor::set_allowed(&P,a->_begin,(lVar4 - lVar5 >> 2) - 1);
        }
        else {
          *(action *)((long)a->_begin + (lVar4 - lVar5) + -4) = aVar8 | 1;
          Search::predictor::set_allowed(&P,a);
        }
        if ((((aVar8 != uVar1) && (1 < uVar1)) && ((uVar1 & 1) != 0)) && (aVar8 != uVar1 - 1)) {
          aVar13 = 1;
        }
      }
      Search::predictor::set_input
                (&P,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar12]);
      uVar6 = Search::search::get_history_length(sch);
      Search::predictor::set_condition_range(&P,hi,uVar6,'p');
      if (1 < uVar11) {
        uVar6 = Search::search::get_history_length(sch);
        uVar7 = Search::search::get_history_length(sch);
        Search::predictor::add_condition_range(&P,uVar6 + hi + 1,uVar7 + 1,'a');
      }
      Search::predictor::set_oracle(&P,aVar13);
      aVar8 = Search::predictor::predict(&P);
      if ((uVar11 == *(ulong *)(piVar2 + 0x12)) &&
         (psVar9 = Search::search::output_abi_cxx11_(sch),
         *(int *)(psVar9 + *(long *)(*(long *)psVar9 + -0x18) + 0x20) == 0)) {
        psVar9 = Search::search::output_abi_cxx11_(sch);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar9 + 0x10));
        std::operator<<(poVar10,' ');
      }
    }
  }
  Search::predictor::~predictor(&P);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  v_array<action>* y_allowed = &(D.allowed_actions);
  Search::predictor P(sch, (ptag)0);
  for (size_t pass = 1; pass <= D.multipass; pass++)
  {
    action last_prediction = 1;
    for (size_t i = 0; i < ec.size(); i++)
    {
      action oracle = ec[i]->l.multi.label;
      size_t len = y_allowed->size();
      P.set_tag((ptag)i + 1);
      P.set_learner_id(pass - 1);
      if (D.encoding == BIO)
      {
        if (last_prediction == 1)
          P.set_allowed(y_allowed->begin(), len - 1);
        else if (last_prediction % 2 == 0)
        {
          (*y_allowed)[len - 1] = last_prediction + 1;
          P.set_allowed(*y_allowed);
        }
        else
        {
          (*y_allowed)[len - 1] = last_prediction;
          P.set_allowed(*y_allowed);
        }
        if ((oracle > 1) && (oracle % 2 == 1) && (last_prediction != oracle) && (last_prediction != oracle - 1))
          oracle = 1;  // if we are supposed to I-X, but last wasn't B-X or I-X, then say O
      }
      else if (D.encoding == BILOU)
      {
        if ((last_prediction == 1) || ((last_prediction - 2) % 4 == 0) ||
            ((last_prediction - 2) % 4 == 3))  // O or unit-X or last-X
        {
          P.set_allowed(D.allowed_actions);
          // we cannot allow in-X or last-X next
          if ((oracle > 1) && (((oracle - 2) % 4 == 2) || ((oracle - 2) % 4 == 3)))
            oracle = 1;
        }
        else  // begin-X or in-X
        {
          action other = ((last_prediction - 2) % 4 == 1) ? (last_prediction + 2) : last_prediction;
          P.set_allowed(last_prediction + 1);
          P.add_allowed(other);
          if ((oracle != last_prediction + 1) && (oracle != other))
            oracle = other;
        }
      }
      P.set_input(*ec[i]);
      P.set_condition_range((ptag)i, sch.get_history_length(), 'p');
      if (pass > 1)
        P.add_condition_range((ptag)(i + 1 + sch.get_history_length()), sch.get_history_length() + 1, 'a');
      P.set_oracle(oracle);
      last_prediction = P.predict();

      if ((pass == D.multipass) && sch.output().good())
        sch.output() << ((D.encoding == BIO) ? last_prediction : bilou_to_bio(last_prediction)) << ' ';
    }
  }
}